

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_basic_constraints(uchar **p,uchar *end,int *ca_istrue,int *max_pathlen)

{
  int iVar1;
  size_t local_40;
  size_t len;
  int *piStack_30;
  int ret;
  int *max_pathlen_local;
  int *ca_istrue_local;
  uchar *end_local;
  uchar **p_local;
  
  *ca_istrue = 0;
  *max_pathlen = 0;
  piStack_30 = max_pathlen;
  max_pathlen_local = ca_istrue;
  ca_istrue_local = (int *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_40,0x30);
  if (len._4_4_ == 0) {
    if (*(int **)end_local == ca_istrue_local) {
      p_local._4_4_ = 0;
    }
    else {
      len._4_4_ = mbedtls_asn1_get_bool
                            ((uchar **)end_local,(uchar *)ca_istrue_local,max_pathlen_local);
      if (len._4_4_ != 0) {
        if (len._4_4_ == -0x62) {
          len._4_4_ = mbedtls_asn1_get_int
                                ((uchar **)end_local,(uchar *)ca_istrue_local,max_pathlen_local);
        }
        if (len._4_4_ != 0) {
          return len._4_4_ + -0x2500;
        }
        if (*max_pathlen_local != 0) {
          *max_pathlen_local = 1;
        }
      }
      if (*(int **)end_local == ca_istrue_local) {
        p_local._4_4_ = 0;
      }
      else {
        iVar1 = mbedtls_asn1_get_int((uchar **)end_local,(uchar *)ca_istrue_local,piStack_30);
        if (iVar1 == 0) {
          if (*(int **)end_local == ca_istrue_local) {
            *piStack_30 = *piStack_30 + 1;
            p_local._4_4_ = 0;
          }
          else {
            p_local._4_4_ = -0x2566;
          }
        }
        else {
          p_local._4_4_ = iVar1 + -0x2500;
        }
      }
    }
  }
  else {
    p_local._4_4_ = len._4_4_ + -0x2500;
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_basic_constraints( unsigned char **p,
                                       const unsigned char *end,
                                       int *ca_istrue,
                                       int *max_pathlen )
{
    int ret;
    size_t len;

    /*
     * BasicConstraints ::= SEQUENCE {
     *      cA                      BOOLEAN DEFAULT FALSE,
     *      pathLenConstraint       INTEGER (0..MAX) OPTIONAL }
     */
    *ca_istrue = 0; /* DEFAULT FALSE */
    *max_pathlen = 0; /* endless */

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_bool( p, end, ca_istrue ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            ret = mbedtls_asn1_get_int( p, end, ca_istrue );

        if( ret != 0 )
            return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

        if( *ca_istrue != 0 )
            *ca_istrue = 1;
    }

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_int( p, end, max_pathlen ) ) != 0 )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS + ret );

    if( *p != end )
        return( MBEDTLS_ERR_X509_INVALID_EXTENSIONS +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    (*max_pathlen)++;

    return( 0 );
}